

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D::ASTCRenderer2D
          (ASTCRenderer2D *this,Context *context,CompressedTexFormat format,deUint32 randomSeed)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  Vector<int,_3> local_3c;
  VecAccess<int,_3,_2> local_30;
  deUint32 local_20;
  CompressedTexFormat local_1c;
  deUint32 randomSeed_local;
  CompressedTexFormat format_local;
  Context *context_local;
  ASTCRenderer2D *this_local;
  
  this->m_context = context;
  local_20 = randomSeed;
  local_1c = format;
  _randomSeed_local = context;
  context_local = (Context *)this;
  context_00 = gles3::Context::getRenderContext(context);
  this_00 = gles3::Context::getTestContext(_randomSeed_local);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  this->m_format = local_1c;
  tcu::getBlockPixelSize((tcu *)&local_3c,local_1c);
  local_30 = tcu::Vector<int,_3>::xy(&local_3c);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&this->m_blockSize);
  this->m_astcSupport = ASTCSUPPORTLEVEL_NONE;
  tcu::Vector<float,_4>::Vector(&this->m_colorScale,-1.0);
  tcu::Vector<float,_4>::Vector(&this->m_colorBias,-1.0);
  de::Random::Random(&this->m_rnd,local_20);
  this->m_initialized = false;
  return;
}

Assistant:

ASTCRenderer2D::ASTCRenderer2D (Context&			context,
								CompressedTexFormat	format,
								deUint32			randomSeed)
	: m_context			(context)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_format			(format)
	, m_blockSize		(tcu::getBlockPixelSize(format).xy())
	, m_astcSupport		(ASTCSUPPORTLEVEL_NONE)
	, m_colorScale		(-1.0f)
	, m_colorBias		(-1.0f)
	, m_rnd				(randomSeed)
	, m_initialized		(false)
{
	DE_ASSERT(tcu::getBlockPixelSize(format).z() == 1);
}